

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

void __thiscall llvm::raw_ostream::~raw_ostream(raw_ostream *this)

{
  raw_ostream *this_local;
  
  this->_vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_030a4da0;
  if (this->OutBufCur == this->OutBufStart) {
    if ((this->BufferMode == InternalBuffer) && (this->OutBufStart != (char *)0x0)) {
      operator_delete__(this->OutBufStart);
    }
    return;
  }
  __assert_fail("OutBufCur == OutBufStart && \"raw_ostream destructor called with non-empty buffer!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                ,0x56,"virtual llvm::raw_ostream::~raw_ostream()");
}

Assistant:

raw_ostream::~raw_ostream() {
  // raw_ostream's subclasses should take care to flush the buffer
  // in their destructors.
  assert(OutBufCur == OutBufStart &&
         "raw_ostream destructor called with non-empty buffer!");

  if (BufferMode == BufferKind::InternalBuffer)
    delete [] OutBufStart;
}